

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int outfile(char *filename,int rgb_dir,int vdir,int x,int y,int comp,void *data,int alpha,int pad,
           char *fmt,...)

{
  char in_AL;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [48];
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined1 local_48 [8];
  va_list v;
  FILE *f;
  int comp_local;
  int y_local;
  int x_local;
  int vdir_local;
  int rgb_dir_local;
  char *filename_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  v[0].reg_save_area = fopen(filename,"wb");
  if ((FILE *)v[0].reg_save_area != (FILE *)0x0) {
    v[0].overflow_arg_area = local_f8;
    v[0]._0_8_ = &stack0x00000028;
    local_48._4_4_ = 0x30;
    local_48._0_4_ = 0x30;
    writefv((FILE *)v[0].reg_save_area,fmt,(__va_list_tag *)local_48);
    write_pixels((FILE *)v[0].reg_save_area,rgb_dir,vdir,x,y,comp,data,alpha,pad);
    fclose((FILE *)v[0].reg_save_area);
  }
  return (int)(v[0].reg_save_area != (void *)0x0);
}

Assistant:

static int outfile(char const *filename, int rgb_dir, int vdir, int x, int y, int comp, void *data, int alpha, int pad, char *fmt, ...)
{
   FILE *f = fopen(filename, "wb");
   if (f) {
      va_list v;
      va_start(v, fmt);
      writefv(f, fmt, v);
      va_end(v);
      write_pixels(f,rgb_dir,vdir,x,y,comp,data,alpha,pad);
      fclose(f);
   }
   return f != NULL;
}